

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read.c
# Opt level: O0

int test(LIBSSH2_SESSION *session)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  uint local_564;
  uint i;
  ssize_t err;
  char buf [1024];
  char *userauth_list;
  char *env;
  char remote_command [256];
  long local_40;
  unsigned_long xfer_count;
  unsigned_long xfer_bs;
  LIBSSH2_CHANNEL *channel;
  unsigned_long xfer_bytes;
  int rc;
  LIBSSH2_SESSION *session_local;
  
  channel = (LIBSSH2_CHANNEL *)0x0;
  local_40 = 0x22330;
  iVar1 = openssh_fixture_have_docker();
  if (iVar1 == 0) {
    username = getenv("USER");
  }
  pcVar6 = username;
  sVar2 = strlen(username);
  buf._1016_8_ = libssh2_userauth_list(session,pcVar6,sVar2 & 0xffffffff);
  if ((char *)buf._1016_8_ == (char *)0x0) {
    print_last_session_error("libssh2_userauth_list");
    session_local._4_4_ = 1;
  }
  else {
    pcVar3 = strstr((char *)buf._1016_8_,"publickey");
    pcVar6 = username;
    if (pcVar3 == (char *)0x0) {
      fprintf(_stderr,"\'publickey\' was expected in userauth list: %s\n",buf._1016_8_);
      session_local._4_4_ = 1;
    }
    else {
      sVar2 = strlen(username);
      pcVar3 = srcdir_path(key_file_public);
      pcVar4 = srcdir_path(key_file_private);
      iVar1 = libssh2_userauth_publickey_fromfile_ex
                        (session,pcVar6,sVar2 & 0xffffffff,pcVar3,pcVar4,0);
      if (iVar1 == 0) {
        lVar5 = libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0,0);
        if (lVar5 == 0) {
          fprintf(_stderr,"Unable to open a session\n");
        }
        else {
          pcVar6 = getenv("FIXTURE_XFER_COUNT");
          if (pcVar6 != (char *)0x0) {
            local_40 = strtol(pcVar6,(char **)0x0,0);
            fprintf(_stderr,"Custom xfer_count: %lu\n",local_40);
          }
          snprintf((char *)&env,0x100,"dd if=/dev/zero bs=%lu count=%lu status=none",0x3e5,local_40)
          ;
          sVar2 = strlen((char *)&env);
          iVar1 = libssh2_channel_process_startup(lVar5,"exec",4,&env,sVar2 & 0xffffffff);
          if (iVar1 == 0) {
            while (iVar1 = libssh2_channel_eof(lVar5), iVar1 == 0) {
              uVar7 = libssh2_channel_read_ex(lVar5,0,&err,0x400);
              if ((long)uVar7 < 0) {
                fprintf(_stderr,"Unable to read response: %ld\n",uVar7);
              }
              else {
                for (local_564 = 0; local_564 < uVar7; local_564 = local_564 + 1) {
                  if (buf[(ulong)local_564 - 8] != '\0') {
                    fprintf(_stderr,"Bad data received\n");
                    break;
                  }
                }
                channel = (LIBSSH2_CHANNEL *)((long)&(channel->node).next + (ulong)local_564);
              }
            }
            iVar1 = libssh2_channel_close(lVar5);
            if (iVar1 != 0) {
              fprintf(_stderr,"Unable to close channel\n");
            }
            if (lVar5 != 0) {
              libssh2_channel_free(lVar5);
            }
          }
          else {
            fprintf(_stderr,"Unable to request command on channel\n");
          }
        }
        if (channel == (LIBSSH2_CHANNEL *)(local_40 * 0x3e5)) {
          session_local._4_4_ = 0;
        }
        else {
          fprintf(_stderr,"Not enough bytes received: %lu not %lu\n",channel,local_40 * 0x3e5);
          session_local._4_4_ = 1;
        }
      }
      else {
        print_last_session_error("libssh2_userauth_publickey_fromfile_ex");
        session_local._4_4_ = 1;
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
    int rc;
    unsigned long xfer_bytes = 0;
    LIBSSH2_CHANNEL *channel;

    /* Size and number of blocks to transfer
     * This needs to be large to increase the chance of timing effects causing
     * different code paths to be hit in the unframing code, but not so long
     * that the integration tests take too long. 5 seconds of run time is
     * probably a reasonable compromise. The block size is an odd number to
     * increase the chance that various internal buffer and block boundaries
     * are overlapped. */
    const unsigned long xfer_bs = 997;
    unsigned long xfer_count = 140080;

    char remote_command[256];
    const char *env;
    const char *userauth_list;

    /* Ignore our hard-wired Dockerfile user when not running under Docker */
    if(!openssh_fixture_have_docker()) {
        username = getenv("USER");
#ifdef _WIN32
        if(!username)
            username = getenv("USERNAME");
#endif
    }

    userauth_list = libssh2_userauth_list(session, username,
                                          (unsigned int)strlen(username));
    if(!userauth_list) {
        print_last_session_error("libssh2_userauth_list");
        return 1;
    }

    if(!strstr(userauth_list, "publickey")) {
        fprintf(stderr, "'publickey' was expected in userauth list: %s\n",
                userauth_list);
        return 1;
    }

    rc = libssh2_userauth_publickey_fromfile_ex(session, username,
                                                (unsigned int)strlen(username),
                                                srcdir_path(key_file_public),
                                                srcdir_path(key_file_private),
                                                NULL);
    if(rc) {
        print_last_session_error("libssh2_userauth_publickey_fromfile_ex");
        return 1;
    }

    /* Request a session channel on which to run a shell */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Unable to open a session\n");
        goto shutdown;
    }

    env = getenv("FIXTURE_XFER_COUNT");
    if(env) {
        xfer_count = (unsigned long)strtol(env, NULL, 0);
        fprintf(stderr, "Custom xfer_count: %lu\n", xfer_count);
    }

    /* command to transfer the desired amount of data */
    snprintf(remote_command, sizeof(remote_command),
             "dd if=/dev/zero bs=%lu count=%lu status=none",
             xfer_bs, xfer_count);

    /* Send the command to transfer data */
    if(libssh2_channel_exec(channel, remote_command)) {
        fprintf(stderr, "Unable to request command on channel\n");
        goto shutdown;
    }

    /* Read data */
    while(!libssh2_channel_eof(channel)) {
        char buf[1024];
        ssize_t err = libssh2_channel_read(channel, buf, sizeof(buf));
        if(err < 0)
            fprintf(stderr, "Unable to read response: %ld\n", (long)err);
        else {
            unsigned int i;
            for(i = 0; i < (unsigned long)err; ++i) {
                if(buf[i]) {
                    fprintf(stderr, "Bad data received\n");
                    /* Test will fail below due to bad data length */
                    break;
                }
            }
            xfer_bytes += i;
        }
    }

    /* Shut down */
    if(libssh2_channel_close(channel))
        fprintf(stderr, "Unable to close channel\n");

    if(channel) {
        libssh2_channel_free(channel);
        channel = NULL;
    }

shutdown:

    /* Test check */
    if(xfer_bytes != xfer_count * xfer_bs) {
        fprintf(stderr, "Not enough bytes received: %lu not %lu\n",
                xfer_bytes, xfer_count * xfer_bs);
        return 1;  /* error */
    }
    return 0;
}